

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,Domain *aValue,
          vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          *aRet)

{
  undefined8 uVar1;
  Status SVar2;
  Domain *this_00;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  string local_90;
  function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> local_70;
  undefined1 local_50 [40];
  _Any_data __tmp;
  
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  pcStack_c0 = std::
               _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:354:48)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:354:48)>
             ::_M_manager;
  Domain::Domain((Domain *)local_50,aValue);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  this_00 = (Domain *)operator_new(0x28);
  Domain::Domain(this_00,(Domain *)local_50);
  uVar1 = local_b8._8_8_;
  local_a8 = local_c8;
  local_b8._M_unused._M_object = local_d8._M_unused._M_object;
  local_b8._8_8_ = local_d8._8_8_;
  local_d8._8_8_ = uVar1;
  local_c8 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:356:12)>
             ::_M_manager;
  pcStack_a0 = pcStack_c0;
  pcStack_c0 = std::
               _Function_handler<bool_(const_ot::commissioner::persistent_storage::Domain_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:356:12)>
               ::_M_invoke;
  local_d8._M_unused._M_object = this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::function<bool_(const_ot::commissioner::persistent_storage::Domain_&)>::function
            (&local_70,
             (function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *)&local_d8);
  std::__cxx11::string::string((string *)&local_90,(string *)JSON_DOM_abi_cxx11_);
  SVar2 = LookupPred<ot::commissioner::persistent_storage::Domain>(this,&local_70,aRet,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  return SVar2;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(Domain const &aValue, std::vector<Domain> &aRet)
{
    std::function<bool(Domain const &)> pred = [](Domain const &) { return true; };

    pred = [aValue](Domain const &el) {
        bool aRet = (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
                    (aValue.mName.empty() || (aValue.mName == el.mName));
        return aRet;
    };

    return LookupPred<Domain>(pred, aRet, JSON_DOM);
}